

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

ParameterError proto2num(OperationConfig *config,char **val,char **ostr,char *str)

{
  char **ppcVar1;
  long *plVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  CURLcode CVar8;
  long *__dest;
  char *pcVar9;
  size_t sVar10;
  long *plVar11;
  size_t sVar12;
  long *plVar13;
  ParameterError PVar14;
  int iVar15;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  bool bVar19;
  dynbuf obuf;
  char buffer [32];
  dynbuf local_78;
  char local_58 [40];
  
  curlx_dyn_init(&local_78,0x2c0);
  __dest = (long *)malloc(proto_count * 8 + 8);
  if (__dest == (long *)0x0) {
    PVar14 = PARAM_NO_MEM;
  }
  else {
    *__dest = 0;
    pcVar9 = *val;
    while (pcVar9 != (char *)0x0) {
      pcVar9 = proto_token(pcVar9);
      plVar11 = __dest;
      if (pcVar9 != (char *)0x0) {
        do {
          plVar13 = plVar11;
          if ((char *)*plVar13 == (char *)0x0) break;
          plVar11 = plVar13 + 1;
        } while ((char *)*plVar13 != pcVar9);
        if (*plVar13 == 0) {
          *plVar13 = (long)pcVar9;
          plVar13[1] = 0;
        }
      }
      ppcVar1 = val + 1;
      val = val + 1;
      pcVar9 = *ppcVar1;
    }
    do {
      cVar3 = *str;
      if (cVar3 == '\0') break;
      pcVar9 = strchr(str,0x2c);
      bVar19 = pcVar9 == (char *)0x0;
      if (bVar19) {
        sVar10 = strlen(str);
        pcVar17 = (char *)(sVar10 - 1);
LAB_0011b900:
        pcVar18 = str + 1;
        iVar15 = 0;
        if (cVar3 == '+') {
          bVar5 = false;
LAB_0011b93c:
          bVar4 = false;
        }
        else {
          if (cVar3 == '=') {
            iVar15 = 2;
            bVar5 = true;
            goto LAB_0011b93c;
          }
          if (cVar3 == '-') {
            iVar15 = 1;
            bVar4 = true;
            bVar5 = false;
          }
          else {
            pcVar17 = pcVar17 + 1;
            bVar5 = false;
            bVar4 = false;
            iVar15 = 0;
            pcVar18 = str;
          }
        }
        if ((pcVar17 == (char *)0x3) && (iVar7 = curl_strnequal(pcVar18,"all",3), iVar7 != 0)) {
          if (bVar4) {
            *__dest = 0;
          }
          else {
            memcpy(__dest,built_in_protos,proto_count * 8 + 8);
          }
        }
        else {
          curl_msnprintf(local_58,0x20,"%.*s",(ulong)pcVar17 & 0xffffffff,pcVar18);
          pcVar17 = proto_token(local_58);
          if (pcVar17 == (char *)0x0) {
            if (bVar5) {
              *__dest = 0;
            }
            warnf(config->global,"unrecognized protocol \'%s\'",local_58);
          }
          else {
            plVar11 = __dest;
            if (iVar15 != 0) {
              plVar13 = __dest + -1;
              if (iVar15 != 2) {
                do {
                  plVar11 = plVar13 + 1;
                  plVar13 = plVar13 + 1;
                  if ((char *)*plVar11 == (char *)0x0) break;
                } while ((char *)*plVar11 != pcVar17);
                plVar11 = __dest + -2;
                if (*plVar13 != 0) {
                  do {
                    plVar2 = plVar11 + 2;
                    plVar11 = plVar11 + 1;
                  } while (*plVar2 != 0);
                  *plVar13 = *plVar11;
                  *plVar11 = 0;
                }
                goto LAB_0011baa7;
              }
              *__dest = 0;
            }
            do {
              plVar13 = plVar11;
              if ((char *)*plVar13 == (char *)0x0) break;
              plVar11 = plVar13 + 1;
            } while ((char *)*plVar13 != pcVar17);
            if (*plVar13 == 0) {
              *plVar13 = (long)pcVar17;
              plVar13[1] = 0;
            }
          }
        }
LAB_0011baa7:
        str = pcVar9 + 1;
        if (pcVar9 == (char *)0x0) {
          str = pcVar18;
        }
      }
      else {
        if (str != pcVar9) {
          pcVar17 = pcVar9 + ~(ulong)str;
          goto LAB_0011b900;
        }
        str = str + 1;
        bVar19 = false;
      }
    } while (!bVar19);
    lVar16 = -8;
    do {
      lVar6 = lVar16 + 8;
      lVar16 = lVar16 + 8;
    } while (*(long *)((long)__dest + lVar6) != 0);
    qsort(__dest,lVar16 >> 3,8,struplocompare4sort);
    CVar8 = curlx_dyn_addn(&local_78,"",0);
    if ((*__dest != 0) && (CVar8 == CURLE_OK)) {
      plVar11 = __dest;
      do {
        plVar11 = plVar11 + 1;
        CVar8 = curlx_dyn_addf(&local_78,"%s,");
        if (*plVar11 == 0) break;
      } while (CVar8 == CURLE_OK);
    }
    free(__dest);
    sVar12 = curlx_dyn_len(&local_78);
    curlx_dyn_setlen(&local_78,sVar12 - 1);
    free(*ostr);
    pcVar9 = curlx_dyn_ptr(&local_78);
    *ostr = pcVar9;
    PVar14 = PARAM_OK;
    if (pcVar9 == (char *)0x0) {
      PVar14 = PARAM_NO_MEM;
    }
  }
  return PVar14;
}

Assistant:

ParameterError proto2num(struct OperationConfig *config,
                         const char * const *val, char **ostr, const char *str)
{
  const char **protoset;
  struct curlx_dynbuf obuf;
  size_t proto;
  CURLcode result;

  curlx_dyn_init(&obuf, MAX_PROTOSTRING);

  protoset = malloc((proto_count + 1) * sizeof(*protoset));
  if(!protoset)
    return PARAM_NO_MEM;

  /* Preset protocol set with default values. */
  protoset[0] = NULL;
  for(; *val; val++) {
    const char *p = proto_token(*val);

    if(p)
      protoset_set(protoset, p);
  }

  while(*str) {
    const char *next = strchr(str, ',');
    size_t plen;
    enum e_action { allow, deny, set } action = allow;

    if(next) {
      if(str == next) {
        str++;
        continue;
      }
      plen = next - str - 1;
    }
    else
      plen = strlen(str) - 1;

    /* Process token modifiers */
    switch(*str++) {
    case '=':
      action = set;
      break;
    case '-':
      action = deny;
      break;
    case '+':
      action = allow;
      break;
    default:
      /* no modifier */
      str--;
      plen++;
      break;
    }

    if((plen == 3) && curl_strnequal(str, "all", 3)) {
      switch(action) {
      case deny:
        protoset[0] = NULL;
        break;
      case allow:
      case set:
        memcpy((char *) protoset,
               built_in_protos, (proto_count + 1) * sizeof(*protoset));
        break;
      }
    }
    else {
      char buffer[32];
      const char *p;
      msnprintf(buffer, sizeof(buffer), "%.*s", (int)plen, str);

      p = proto_token(buffer);

      if(p)
        switch(action) {
        case deny:
          protoset_clear(protoset, p);
          break;
        case set:
          protoset[0] = NULL;
          FALLTHROUGH();
        case allow:
          protoset_set(protoset, p);
          break;
        }
      else { /* unknown protocol */
        /* If they have specified only this protocol, we say treat it as
           if no protocols are allowed */
        if(action == set)
          protoset[0] = NULL;
        warnf(config->global, "unrecognized protocol '%s'", buffer);
      }
    }
    if(next)
      str = next + 1;
    else
      break;
  }

  /* We need the protocols in alphabetic order for CI tests requirements. */
  qsort((char *) protoset, protoset_index(protoset, NULL), sizeof(*protoset),
        struplocompare4sort);

  result = curlx_dyn_addn(&obuf, "", 0);
  for(proto = 0; protoset[proto] && !result; proto++)
    result = curlx_dyn_addf(&obuf, "%s,", protoset[proto]);
  free((char *) protoset);
  curlx_dyn_setlen(&obuf, curlx_dyn_len(&obuf) - 1);
  free(*ostr);
  *ostr = curlx_dyn_ptr(&obuf);

  return *ostr ? PARAM_OK : PARAM_NO_MEM;
}